

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantOuterEdgeCase::iterate
          (InvariantOuterEdgeCase *this)

{
  TessPrimitiveType TVar1;
  SpacingMode SVar2;
  int iVar3;
  deUint32 dVar4;
  int y;
  deUint32 tfPrimTypeGL;
  TestLog *this_00;
  undefined4 extraout_var;
  char *str;
  Functions *gl_00;
  const_reference pvVar5;
  RenderContext *renderCtx_00;
  size_type sVar6;
  const_reference this_01;
  MessageBuilder *pMVar7;
  reference this_02;
  ShaderProgram *this_03;
  TestLog *pTVar8;
  _anonymous_namespace_ *this_04;
  const_reference outerLevels_00;
  const_reference __x;
  size_type sVar9;
  reference this_05;
  _anonymous_namespace_ *this_06;
  float *pfVar10;
  bool bVar11;
  float constantOuterLevel;
  pair<std::_Rb_tree_const_iterator<tcu::Vector<float,_3>_>,_bool> pVar12;
  VertexArrayBinding *local_1210;
  string local_ff0;
  string local_fd0;
  MessageBuilder local_fb0;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  MessageBuilder local_db0;
  string local_c30;
  string local_c10;
  string local_bf0;
  size_type local_bd0;
  MessageBuilder local_bc8;
  MessageBuilder local_a48;
  MessageBuilder local_8c8;
  int local_744;
  _Rb_tree_const_iterator<tcu::Vector<float,_3>_> _Stack_740;
  int refNumVerticesOnOuterEdge;
  undefined1 local_738;
  const_reference local_730;
  Vec3 *vtx;
  undefined1 local_720 [4];
  int vtxNdx;
  Vec3Set outerEdgeVertices;
  int patchNumVertices;
  float *outerLevels;
  float *innerLevels;
  int patchNdx;
  size_type local_6b0;
  MessageBuilder local_6a8;
  MessageBuilder local_528;
  int local_3a8;
  int local_3a4;
  int numVerticesRead;
  int refNumVertices;
  Result tfResult;
  deUint32 programGL;
  Program *program;
  undefined1 local_368 [4];
  int programNdx;
  MessageBuilder local_348;
  undefined1 local_1c8 [8];
  Vec3Set firstOuterEdgeVertices;
  string local_190;
  undefined1 *local_170;
  undefined1 local_168 [8];
  VertexArrayBinding bindings [1];
  undefined1 local_110 [8];
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  int outerEdgeLevelCaseNdx;
  OuterEdgeDescription *edgeDesc;
  undefined1 local_e0 [4];
  int outerEdgeIndex;
  TFHandler tfHandler;
  int usePointModeI;
  undefined1 local_80 [8];
  vector<float,_std::allocator<float>_> patchTessLevels;
  undefined1 local_60 [4];
  int maxNumVerticesInDrawCall;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  int numPatchesPerDrawCall;
  Functions *gl;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  InvariantOuterEdgeCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  viewport._8_8_ = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&gl,(RenderTarget *)CONCAT44(extraout_var,iVar3),0x10,0x10,dVar4);
  gl_00 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  edgeDescriptions.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 10;
  outerEdgeDescriptions
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
              *)local_60,this->m_primitiveType);
  patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  constantOuterLevel = arrayMax<float,12>(&iterate::singleOuterEdgeLevels);
  generatePatchTessLevels((vector<float,_std::allocator<float>_> *)local_80,10,0,constantOuterLevel)
  ;
  for (tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object = 0;
      iVar3 = patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_,
      (int)tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object < 2;
      tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object =
           tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object + 1) {
    TVar1 = this->m_primitiveType;
    SVar2 = this->m_spacing;
    bVar11 = tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object != 0;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_80,0);
    y = multiplePatchReferenceVertexCount(TVar1,SVar2,bVar11,pvVar5,10);
    patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = de::max<int>(iVar3,y);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_80);
  renderCtx_00 = Context::getRenderContext((this->super_TestCase).m_context);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_e0,renderCtx_00,
             patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  setViewport(gl_00,(RandomViewport *)&gl);
  (*gl_00->patchParameteri)(0x8e72,6);
  for (edgeDesc._4_4_ = 0;
      sVar6 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
              ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                      *)local_60), edgeDesc._4_4_ < (int)sVar6; edgeDesc._4_4_ = edgeDesc._4_4_ + 1)
  {
    this_01 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                            *)local_60,(long)edgeDesc._4_4_);
    for (patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < 0xc;
        patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      generatePatchTessLevels
                ((vector<float,_std::allocator<float>_> *)local_110,10,edgeDesc._4_4_,
                 iterate::singleOuterEdgeLevels
                 [patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_]);
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
      local_170 = local_168;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"in_v_attr",
                 (allocator<char> *)
                 ((long)&firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count + 7
                 ));
      sVar6 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)local_110);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_110,0);
      glu::va::Float((VertexArrayBinding *)local_168,&local_190,1,(int)sVar6,0,pvVar5);
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count + 7
                 ));
      std::
      set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
      ::set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
             *)local_1c8);
      tcu::TestLog::operator<<(&local_348,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_348,(char (*) [39])"Testing with outer tessellation level ");
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,iterate::singleOuterEdgeLevels +
                                 patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])" for the ");
      (anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                ((string *)local_368,this_01);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_368);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [70])
                                 " edge, and with various levels for other edges, and with all programs"
                         );
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)local_368);
      tcu::MessageBuilder::~MessageBuilder(&local_348);
      for (program._4_4_ = 0;
          sVar6 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                  ::size(&this->m_programs), program._4_4_ < (int)sVar6;
          program._4_4_ = program._4_4_ + 1) {
        this_02 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                  ::operator[](&this->m_programs,(long)program._4_4_);
        this_03 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this_02->program);
        tfResult.varying.
        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = glu::ShaderProgram::getProgram(this_03);
        (*gl_00->useProgram)
                  (tfResult.varying.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        dVar4 = tfResult.varying.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        tfPrimTypeGL = outputPrimitiveTypeGL
                                 (this->m_primitiveType,(bool)(this_02->usePointMode & 1));
        sVar6 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)local_110);
        TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                  ((Result *)&numVerticesRead,
                   (TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_e0,dVar4,tfPrimTypeGL,1
                   ,(VertexArrayBinding *)local_168,(int)sVar6);
        TVar1 = this->m_primitiveType;
        SVar2 = this->m_spacing;
        bVar11 = this_02->usePointMode;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_110,0);
        iVar3 = 10;
        local_3a4 = multiplePatchReferenceVertexCount(TVar1,SVar2,(bool)(bVar11 & 1),pvVar5,10);
        local_3a8 = 0;
        sVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                          ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
                           )&tfResult);
        if ((int)sVar6 == local_3a4) {
          for (innerLevels._0_4_ = 0; (int)innerLevels < 10;
              innerLevels._0_4_ = (int)innerLevels + 1) {
            this_04 = (_anonymous_namespace_ *)
                      std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_110,
                                 (long)((int)innerLevels * 6));
            outerLevels_00 =
                 std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_110,
                            (long)((int)innerLevels * 6 + 2));
            pvVar5 = outerLevels_00;
            outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                 referenceVertexCount
                           (this->m_primitiveType,this->m_spacing,(bool)(this_02->usePointMode & 1),
                            (float *)this_04,outerLevels_00);
            std::
            set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
            ::set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   *)local_720);
            for (vtx._4_4_ = local_3a8; iVar3 = (int)pvVar5,
                vtx._4_4_ <
                local_3a8 + outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
                ; vtx._4_4_ = vtx._4_4_ + 1) {
              local_730 = std::
                          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                          operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                      *)&tfResult,(long)vtx._4_4_);
              bVar11 = OuterEdgeDescription::contains(this_01,local_730);
              if (bVar11) {
                __x = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                      operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  *)&tfResult,(long)vtx._4_4_);
                pVar12 = std::
                         set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ::insert((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   *)local_720,__x);
                _Stack_740 = pVar12.first._M_node;
                local_738 = pVar12.second;
              }
            }
            pfVar10 = (float *)(long)patchTessLevels_1.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_;
            local_744 = getClampedRoundedTessLevel
                                  (this->m_spacing,iterate::singleOuterEdgeLevels[(long)pfVar10]);
            local_744 = local_744 + 1;
            sVar9 = std::
                    set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ::size((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)local_720);
            if ((int)sVar9 == local_744) {
              if ((program._4_4_ == 0) && ((int)innerLevels == 0)) {
                std::
                set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::operator=((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_1c8,
                            (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_720);
              }
              else {
                bVar11 = std::operator!=((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                          *)local_1c8,
                                         (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                          *)local_720);
                if (bVar11) {
                  tcu::TestLog::operator<<
                            (&local_db0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar7 = tcu::MessageBuilder::operator<<
                                     (&local_db0,
                                      (char (*) [78])
                                      "Failure: vertices generated for the edge differ between the following cases:\n"
                                     );
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])"  - case A: ");
                  this_05 = std::
                            vector<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                            ::operator[](&this->m_programs,0);
                  (anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                            (&local_dd0,this_05);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_dd0);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [24])0xf1edbc);
                  this_06 = (_anonymous_namespace_ *)
                            std::vector<float,_std::allocator<float>_>::operator[]
                                      ((vector<float,_std::allocator<float>_> *)local_110,0);
                  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                                     ((vector<float,_std::allocator<float>_> *)local_110,2);
                  (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                            (&local_df0,this_06,pvVar5,pfVar10);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_df0);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xf12600);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])"  - case B: ");
                  (anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                            (&local_e10,this_02);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_e10);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [24])0xf1edbc);
                  (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                            (&local_e30,this_04,outerLevels_00,pfVar10);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_e30);
                  tcu::MessageBuilder::operator<<
                            (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::string::~string((string *)&local_e30);
                  std::__cxx11::string::~string((string *)&local_e10);
                  std::__cxx11::string::~string((string *)&local_df0);
                  std::__cxx11::string::~string((string *)&local_dd0);
                  tcu::MessageBuilder::~MessageBuilder(&local_db0);
                  tcu::TestLog::operator<<
                            (&local_fb0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar7 = tcu::MessageBuilder::operator<<
                                     (&local_fb0,
                                      (char (*) [59])
                                      "Note: resulting vertices for the edge for the cases were:\n")
                  ;
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])"  - case A: ");
                  containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                            (&local_fd0,(Functional *)local_1c8,
                             (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)0x5,0xe,iVar3);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_fd0);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xf12600);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])"  - case B: ");
                  containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                            (&local_ff0,(Functional *)local_720,
                             (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)0x5,0xe,iVar3);
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_ff0);
                  tcu::MessageBuilder::operator<<
                            (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::string::~string((string *)&local_ff0);
                  std::__cxx11::string::~string((string *)&local_fd0);
                  tcu::MessageBuilder::~MessageBuilder(&local_fb0);
                  tcu::TestContext::setTestResult
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                             QP_TEST_RESULT_FAIL,"Invalid set of vertices");
                  this_local._4_4_ = STOP;
                  bVar11 = true;
                  goto LAB_006a4a18;
                }
              }
              local_3a8 = outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ +
                          local_3a8;
              bVar11 = false;
            }
            else {
              tcu::TestLog::operator<<
                        (&local_bc8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (&local_bc8,
                                  (char (*) [50])"Failure: the number of vertices on outer edge is "
                                 );
              local_bd0 = std::
                          set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ::size((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  *)local_720);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_bd0);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0xf4afd9);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_744);
              pTVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::TestLog::operator<<
                        (&local_a48,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (&local_a48,
                                  (char (*) [39])"Note: vertices on the outer edge are:\n");
              pfVar10 = (float *)0x0;
              containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                        (&local_bf0,(Functional *)local_720,
                         (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          *)0x5,0,iVar3);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_bf0);
              pTVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::TestLog::operator<<
                        (&local_8c8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (&local_8c8,
                                  (char (*) [43])"Note: the following parameters were used: ");
              (anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                        (&local_c10,this_02);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_c10);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [24])0xf1edbc);
              (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                        (&local_c30,this_04,outerLevels_00,pfVar10);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_c30);
              tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::string::~string((string *)&local_c30);
              std::__cxx11::string::~string((string *)&local_c10);
              tcu::MessageBuilder::~MessageBuilder(&local_8c8);
              std::__cxx11::string::~string((string *)&local_bf0);
              tcu::MessageBuilder::~MessageBuilder(&local_a48);
              tcu::MessageBuilder::~MessageBuilder(&local_bc8);
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_FAIL,"Invalid set of vertices");
              this_local._4_4_ = STOP;
              bVar11 = true;
            }
LAB_006a4a18:
            std::
            set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
            ::~set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    *)local_720);
            if (bVar11) goto LAB_006a4a5e;
          }
          bVar11 = false;
        }
        else {
          tcu::TestLog::operator<<(&local_6a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_6a8,
                              (char (*) [67])
                              "Failure: the number of vertices returned by transform feedback is ");
          local_6b0 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                      size((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
                           )&tfResult);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_6b0);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0xf4afd9);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_3a4);
          pTVar8 = tcu::MessageBuilder::operator<<
                             (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_528,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<(&local_528,(char (*) [16])"Note: rendered ");
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(int *)((long)&edgeDescriptions.
                                                                                                        
                                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4));
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(char (*) [128])
                                     " patches in one draw call; tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                             );
          containerStr<std::vector<float,std::allocator<float>>>
                    ((string *)&patchNdx,(Functional *)local_110,
                     (vector<float,_std::allocator<float>_> *)0x6,0,iVar3);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&patchNdx);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&patchNdx);
          tcu::MessageBuilder::~MessageBuilder(&local_528);
          tcu::MessageBuilder::~MessageBuilder(&local_6a8);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of vertices");
          this_local._4_4_ = STOP;
          bVar11 = true;
        }
LAB_006a4a5e:
        TransformFeedbackHandler<tcu::Vector<float,_3>_>::Result::~Result
                  ((Result *)&numVerticesRead);
        if (bVar11) goto LAB_006a4aa7;
      }
      bVar11 = false;
LAB_006a4aa7:
      std::
      set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
      ::~set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              *)local_1c8);
      local_1210 = (VertexArrayBinding *)&bindings[0].pointer.data;
      do {
        local_1210 = local_1210 + -1;
        glu::VertexArrayBinding::~VertexArrayBinding(local_1210);
      } while (local_1210 != (VertexArrayBinding *)local_168);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_110);
      if (bVar11) goto LAB_006a4bb5;
    }
  }
  bVar11 = false;
LAB_006a4bb5:
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_e0);
  if (!bVar11) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    this_local._4_4_ = STOP;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
             *)local_60);
  return this_local._4_4_;
}

Assistant:

InvariantOuterEdgeCase::IterateResult InvariantOuterEdgeCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const int							numPatchesPerDrawCall		= 10;
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(numPatchesPerDrawCall, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));

			for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
				maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall,
												   multiplePatchReferenceVertexCount(m_primitiveType, m_spacing, usePointModeI != 0, &patchTessLevels[0], numPatchesPerDrawCall));
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			setViewport(gl, viewport);
			gl.patchParameteri(GL_PATCH_VERTICES, 6);

			for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
			{
				const OuterEdgeDescription& edgeDesc = edgeDescriptions[outerEdgeIndex];

				for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
				{
					typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

					const vector<float>				patchTessLevels		= generatePatchTessLevels(numPatchesPerDrawCall, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };
					Vec3Set							firstOuterEdgeVertices; // Vertices of the outer edge of the first patch of the first program's draw call; used for comparison with other patches.

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges, and with all programs" << TestLog::EndMessage;

					for (int programNdx = 0; programNdx < (int)m_programs.size(); programNdx++)
					{
						const Program& program		= m_programs[programNdx];
						const deUint32 programGL	= program.program->getProgram();

						gl.useProgram(programGL);

						{
							const TFHandler::Result		tfResult			= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, program.usePointMode),
																											   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
							const int					refNumVertices		= multiplePatchReferenceVertexCount(m_primitiveType, m_spacing, program.usePointMode, &patchTessLevels[0], numPatchesPerDrawCall);
							int							numVerticesRead		= 0;

							if ((int)tfResult.varying.size() != refNumVertices)
							{
								log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
														<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
									<< TestLog::Message << "Note: rendered " << numPatchesPerDrawCall
														<< " patches in one draw call; tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
														<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

								m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
								return STOP;
							}

							// Check the vertices of each patch.

							for (int patchNdx = 0; patchNdx < numPatchesPerDrawCall; patchNdx++)
							{
								const float* const	innerLevels			= &patchTessLevels[6*patchNdx + 0];
								const float* const	outerLevels			= &patchTessLevels[6*patchNdx + 2];
								const int			patchNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, program.usePointMode, innerLevels, outerLevels);
								Vec3Set				outerEdgeVertices;

								// We're interested in just the vertices on the current outer edge.
								for(int vtxNdx = numVerticesRead; vtxNdx < numVerticesRead + patchNumVertices; vtxNdx++)
								{
									const Vec3& vtx = tfResult.varying[vtxNdx];
									if (edgeDesc.contains(vtx))
										outerEdgeVertices.insert(tfResult.varying[vtxNdx]);
								}

								// Check that the outer edge contains an appropriate number of vertices.
								{
									const int refNumVerticesOnOuterEdge = 1 + getClampedRoundedTessLevel(m_spacing, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

									if ((int)outerEdgeVertices.size() != refNumVerticesOnOuterEdge)
									{
										log << TestLog::Message << "Failure: the number of vertices on outer edge is " << outerEdgeVertices.size()
																<< ", expected " << refNumVerticesOnOuterEdge << TestLog::EndMessage
											<< TestLog::Message << "Note: vertices on the outer edge are:\n" << containerStr(outerEdgeVertices, 5, 0) << TestLog::EndMessage
											<< TestLog::Message << "Note: the following parameters were used: " << program.description()
																<< ", tessellation levels: " << tessellationLevelsString(innerLevels, outerLevels) << TestLog::EndMessage;
										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
								}

								// Compare the vertices to those of the first patch (unless this is the first patch).

								if (programNdx == 0 && patchNdx == 0)
									firstOuterEdgeVertices = outerEdgeVertices;
								else
								{
									if (firstOuterEdgeVertices != outerEdgeVertices)
									{
										log << TestLog::Message << "Failure: vertices generated for the edge differ between the following cases:\n"
																<< "  - case A: " << m_programs[0].description() << ", tessellation levels: "
																				  << tessellationLevelsString(&patchTessLevels[0], &patchTessLevels[2]) << "\n"
																<< "  - case B: " << program.description() << ", tessellation levels: "
																				  << tessellationLevelsString(innerLevels, outerLevels) << TestLog::EndMessage;

										log << TestLog::Message << "Note: resulting vertices for the edge for the cases were:\n"
																<< "  - case A: " << containerStr(firstOuterEdgeVertices, 5, 14) << "\n"
																<< "  - case B: " << containerStr(outerEdgeVertices, 5, 14) << TestLog::EndMessage;

										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
								}

								numVerticesRead += patchNumVertices;
							}

							DE_ASSERT(numVerticesRead == (int)tfResult.varying.size());
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}